

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

void re2c::prtHex(ostream *o,uint32_t c)

{
  type_t tVar1;
  opt_t *poVar2;
  ostream *poVar3;
  
  std::operator<<(o,"0x");
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  tVar1 = (poVar2->encoding).type_;
  if (tVar1 < (UTF32|UCS2)) {
    if ((0x23U >> (tVar1 & 0x1f) & 1) != 0) goto LAB_0012f2ee;
    if ((0xcU >> (tVar1 & 0x1f) & 1) == 0) goto LAB_0012f265;
  }
  else {
LAB_0012f265:
    poVar3 = std::operator<<(o,"0123456789ABCDEF"[c >> 0x1c]);
    poVar3 = std::operator<<(poVar3,"0123456789ABCDEF"[c >> 0x18 & 0xf]);
    poVar3 = std::operator<<(poVar3,"0123456789ABCDEF"[c >> 0x14 & 0xf]);
    std::operator<<(poVar3,"0123456789ABCDEF"[c >> 0x10 & 0xf]);
  }
  poVar3 = std::operator<<(o,"0123456789ABCDEF"[c >> 0xc & 0xf]);
  std::operator<<(poVar3,"0123456789ABCDEF"[c >> 8 & 0xf]);
LAB_0012f2ee:
  poVar3 = std::operator<<(o,"0123456789ABCDEF"[c >> 4 & 0xf]);
  std::operator<<(poVar3,"0123456789ABCDEF"[c & 0xf]);
  return;
}

Assistant:

void prtHex(std::ostream& o, uint32_t c)
{
	o << "0x";
	const uint32_t cunit_size = opts->encoding.szCodeUnit ();
	if (cunit_size >= 4)
	{
		o << hexCh (c >> 28u)
			<< hexCh (c >> 24u)
			<< hexCh (c >> 20u)
			<< hexCh (c >> 16u);
	}
	if (cunit_size >= 2)
	{
		o << hexCh (c >> 12u)
			<< hexCh (c >> 8u);
	}
	o << hexCh (c >> 4u)
		<< hexCh (c);
}